

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

void Abc_NodeFreeNames(Vec_Ptr_t *vNames)

{
  int local_14;
  int i;
  Vec_Ptr_t *vNames_local;
  
  if (vNames != (Vec_Ptr_t *)0x0) {
    for (local_14 = 0; local_14 < vNames->nSize; local_14 = local_14 + 1) {
      if (vNames->pArray[local_14] != (void *)0x0) {
        free(vNames->pArray[local_14]);
        vNames->pArray[local_14] = (void *)0x0;
      }
    }
    Vec_PtrFree(vNames);
  }
  return;
}

Assistant:

void Abc_NodeFreeNames( Vec_Ptr_t * vNames )
{
    int i;
    if ( vNames == NULL )
        return;
    for ( i = 0; i < vNames->nSize; i++ )
        ABC_FREE( vNames->pArray[i] );
    Vec_PtrFree( vNames );
}